

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O1

rb_result_t rb_tree_find(rb_tree *tree,void *key,rb_tree_node **value)

{
  bool bVar1;
  int iVar2;
  rb_tree_node *prVar3;
  rb_tree_node *node;
  rb_tree_node *unaff_RBX;
  rb_result_t rVar4;
  rb_tree *unaff_R14;
  rb_tree_node *prVar5;
  rb_result_t local_c;
  
  if (tree == (rb_tree *)0x0) {
    rb_tree_find_cold_3();
  }
  else if (value != (rb_tree_node **)0x0) {
    rb_tree_find_cold_1();
    return local_c;
  }
  rb_tree_find_cold_2();
  if (tree == (rb_tree *)0x0) {
    rb_tree_insert_cold_2();
  }
  else {
    unaff_RBX = node;
    if (node != (rb_tree_node *)0x0) {
      node->left = (rb_tree_node *)0x0;
      node->right = (rb_tree_node *)0x0;
      node->parent = (rb_tree_node *)0x0;
      node->key = key;
      prVar5 = tree->root;
      unaff_R14 = tree;
      if (prVar5 != (rb_tree_node *)0x0) {
        node->color = 1;
        bVar1 = true;
        rVar4 = 0;
        do {
          iVar2 = (*tree->compare)(tree->state,node->key,prVar5->key);
          if (iVar2 == 0) {
            iVar2 = 6;
            rVar4 = 3;
            prVar3 = prVar5;
          }
          else if (iVar2 < 0) {
            bVar1 = false;
            prVar3 = prVar5;
            if (prVar5->left == (rb_tree_node *)0x0) goto LAB_00114c58;
            iVar2 = 0;
            prVar3 = prVar5->left;
          }
          else {
            prVar3 = prVar5->right;
            iVar2 = 0;
            if (prVar3 == (rb_tree_node *)0x0) {
              prVar3 = (rb_tree_node *)&prVar5->right;
LAB_00114c58:
              prVar3->left = node;
              iVar2 = 8;
              prVar3 = prVar5;
            }
          }
          prVar5 = prVar3;
          if (iVar2 != 0) {
            if (iVar2 != 8) {
              return rVar4;
            }
            node->parent = prVar3;
            if (bVar1) {
              tree->rightmost = node;
            }
            __helper_rb_tree_insert_rebalance(tree,node);
            return rVar4;
          }
        } while( true );
      }
      goto LAB_00114c97;
    }
  }
  rb_tree_insert_cold_1();
LAB_00114c97:
  unaff_R14->root = unaff_RBX;
  unaff_R14->rightmost = unaff_RBX;
  unaff_RBX->color = 0;
  return 0;
}

Assistant:

rb_result_t rb_tree_find(struct rb_tree *tree,
                         const void *key,
                         struct rb_tree_node **value)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(value != NULL);

    *value = NULL;

    if (RB_UNLIKELY(tree->root == NULL)) {
        ret = RB_NOT_FOUND;
        goto done;
    }

    struct rb_tree_node *node = tree->root;

    while (node != NULL) {
        int compare = tree->compare(tree->state, key, node->key);

        if (compare < 0) {
            node = node->left;
        } else if (compare == 0) {
            break; /* We found our node */
        } else {
            /* Otherwise, we want the right node, and continue iteration */
            node = node->right;
        }
    }

    if (node == NULL) {
        ret = RB_NOT_FOUND;
        goto done;
    }

    /* Return the node we found */
    *value = node;

done:
    return ret;
}